

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O1

Chuck * SplitIfWorthy(Chuck *chuck,Size size)

{
  ulong uVar1;
  ulong uVar2;
  Chuck *chuck_00;
  
  uVar1 = (ulong)(*(uint *)&chuck->field_0x4 >> 1);
  if (((&chuck->field_0x4)[uVar1 * 8] & 1) != 0) {
    __assert_fail("!GetUsed(chuck)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,0x89,"Chuck *SplitIfWorthy(Chuck *, Size)");
  }
  uVar1 = uVar1 * 8;
  if (size <= uVar1) {
    uVar2 = size + 7 & 0xfffffffffffffff8;
    if (uVar1 < uVar2 + 0x18) {
      chuck_00 = (Chuck *)0x0;
    }
    else {
      SetSize(chuck,uVar2);
      uVar2 = (ulong)(*(uint *)&chuck->field_0x4 >> 1);
      chuck_00 = (Chuck *)(&chuck->lowerSize + uVar2 * 2);
      *(uint *)&chuck_00->field_0x4 = *(uint *)&chuck_00->field_0x4 & 0xfffffffe;
      SetLower(chuck_00,chuck);
      SetSize(chuck_00,uVar1 + uVar2 * -8);
    }
    return chuck_00;
  }
  __assert_fail("size <= GetSize(chuck)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x8a,"Chuck *SplitIfWorthy(Chuck *, Size)");
}

Assistant:

static Chuck *SplitIfWorthy(Chuck *chuck, Size size) {
    assert(!GetUsed(chuck));
    assert(size <= GetSize(chuck));
    if (size < sizeof(Chuck)) {
        size = sizeof(Chuck);
    }
    size = (size + 0x07u) >> 3u << 3u;
    // split to get a chuck whose size equals to sizeof(Chuck) is still worthy
    // it could store sizeof(Chuck) - OVERHEAD_OF_USED_CHUCK bytes data
    if (GetSize(chuck) < size + sizeof(Chuck)) {
        return NULL;
    }
    Chuck *lower = chuck, *higher = GetHigher(chuck);
    SetSize(lower, size);
    Chuck *avail = GetHigher(lower);
    // SetUsed(avail, 0);
    SetUsed(lower, 0);
    // a little worry that compiler is not clever enough to eliminate this
    SetLower(avail, lower);
    SetHigher(avail, higher);
    return avail;
}